

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::FileDescriptorTables::FindNestedSymbol
          (FileDescriptorTables *this,void *parent,string *name)

{
  size_t __c;
  __node_ptr p_Var1;
  anon_union_8_8_13f84498_for_Symbol_2 aVar2;
  uint uVar3;
  Symbol SVar4;
  key_type local_28;
  
  local_28.second = (name->_M_dataplus)._M_p;
  local_28.first = parent;
  __c = anon_unknown_1::PointerStringPairHash::operator()
                  ((PointerStringPairHash *)&local_28,(PointerStringPair *)parent);
  uVar3 = 0;
  p_Var1 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,__c % (this->symbols_by_parent_).
                                        super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
                                        ._M_h._M_bucket_count,&local_28,__c);
  aVar2.descriptor = (Descriptor *)0x0;
  if (p_Var1 != (__node_ptr)0x0) {
    uVar3 = *(uint *)((long)&(p_Var1->
                             super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                             ._M_storage._M_storage + 0x10);
    aVar2 = (anon_union_8_8_13f84498_for_Symbol_2)
            ((anon_union_8_8_13f84498_for_Symbol_2 *)
            ((long)&(p_Var1->
                    super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                    ._M_storage._M_storage + 0x18))->descriptor;
  }
  SVar4._4_4_ = 0;
  SVar4.type = uVar3;
  SVar4.field_1.descriptor = aVar2.descriptor;
  return SVar4;
}

Assistant:

inline Symbol FileDescriptorTables::FindNestedSymbol(
    const void* parent, const string& name) const {
  const Symbol* result =
    FindOrNull(symbols_by_parent_, PointerStringPair(parent, name.c_str()));
  if (result == NULL) {
    return kNullSymbol;
  } else {
    return *result;
  }
}